

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbmstream_rawclient.cpp
# Opt level: O0

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  bool bVar1;
  UInt UVar2;
  size_type sVar3;
  reference pbVar4;
  void *pvVar5;
  ostream *poVar6;
  FastWriter *this;
  size_t in_RCX;
  undefined1 uVar7;
  void *in_RDX;
  string *in_RSI;
  const_iterator cVar8;
  uint fill;
  Value *element_1;
  ValueConstIterator iter_2;
  const_iterator iter_1;
  runtime_error *e;
  Value *element;
  ValueConstIterator iter;
  signalReferences_t signalReferences;
  Value *in_stack_00000408;
  StreamClient *in_stack_fffffffffffffd68;
  Value *in_stack_fffffffffffffd70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd80;
  signalReferences_t *in_stack_fffffffffffffe38;
  StreamClient *in_stack_fffffffffffffe40;
  undefined1 local_198 [68];
  UInt local_154;
  string local_150 [32];
  reference local_130;
  _Base_ptr local_128;
  undefined1 local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  _Base_ptr local_108;
  undefined1 local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8 [2];
  string local_c8 [32];
  string local_a8 [12];
  ArrayIndex in_stack_ffffffffffffff64;
  Value *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  void *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"The following signal(s) are available : ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1355ec);
    Json::Value::begin(in_stack_fffffffffffffd70);
    while( true ) {
      cVar8 = Json::Value::end(in_stack_fffffffffffffd70);
      uVar7 = cVar8.super_ValueIteratorBase.isNull_;
      bVar1 = Json::ValueIteratorBase::operator!=
                        ((ValueIteratorBase *)in_stack_fffffffffffffd70,
                         (SelfType *)in_stack_fffffffffffffd68);
      if (!bVar1) break;
      Json::ValueConstIterator::operator*((ValueConstIterator *)0x1356db);
      Json::Value::asString_abi_cxx11_((Value *)CONCAT71(in_stack_ffffffffffffff89,uVar7));
      poVar6 = std::operator<<((ostream *)&std::cout,local_a8);
      std::operator<<(poVar6,", ");
      std::__cxx11::string::~string(local_a8);
      Json::Value::asString_abi_cxx11_((Value *)CONCAT71(in_stack_ffffffffffffff89,uVar7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd70,(value_type *)in_stack_fffffffffffffd68);
      std::__cxx11::string::~string(local_c8);
      Json::ValueConstIterator::operator++((ValueConstIterator *)in_stack_fffffffffffffd70);
    }
    pvVar5 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    hbm::streaming::StreamClient::subscribe(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    poVar6 = std::operator<<((ostream *)&std::cout,"The following ");
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_30);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar3);
    std::operator<<(poVar6," signal(s) were subscribed: ");
    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffd68);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffd70,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffd68);
    while( true ) {
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffd68);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd70,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd68);
      if (!bVar1) break;
      poVar6 = std::operator<<((ostream *)&std::cout,"\'");
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(local_d8);
      poVar6 = std::operator<<(poVar6,(string *)pbVar4);
      std::operator<<(poVar6,"\' ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(local_d8);
    }
    pvVar5 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffd80);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"The following signal(s) are not available anyore: ");
      cVar8 = Json::Value::begin(in_stack_fffffffffffffd70);
      local_108 = (_Base_ptr)cVar8.super_ValueIteratorBase.current_._M_node;
      local_100 = cVar8.super_ValueIteratorBase.isNull_;
      local_f8 = local_108;
      local_f0 = local_100;
      while( true ) {
        cVar8 = Json::Value::end(in_stack_fffffffffffffd70);
        local_128 = (_Base_ptr)cVar8.super_ValueIteratorBase.current_._M_node;
        local_120 = cVar8.super_ValueIteratorBase.isNull_;
        local_118 = local_128;
        local_110 = local_120;
        bVar1 = Json::ValueIteratorBase::operator!=
                          ((ValueIteratorBase *)in_stack_fffffffffffffd70,
                           (SelfType *)in_stack_fffffffffffffd68);
        if (!bVar1) break;
        local_130 = Json::ValueConstIterator::operator*((ValueConstIterator *)0x135b41);
        Json::Value::asString_abi_cxx11_
                  ((Value *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
        poVar6 = std::operator<<((ostream *)&std::cout,local_150);
        std::operator<<(poVar6,", ");
        std::__cxx11::string::~string(local_150);
        Json::ValueConstIterator::operator++((ValueConstIterator *)in_stack_fffffffffffffd70);
      }
      pvVar5 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
        if (bVar1) {
          bVar1 = Json::Value::empty((Value *)in_stack_fffffffffffffd68);
          if (!bVar1) {
            Json::Value::operator[](in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
            local_154 = Json::Value::asUInt(in_stack_00000408);
            if (0x19 < local_154) {
              hbm::streaming::StreamClient::address_abi_cxx11_(in_stack_fffffffffffffd68);
              poVar6 = std::operator<<((ostream *)&std::cout,(string *)(local_198 + 0x20));
              poVar6 = std::operator<<(poVar6,": ring buffer fill level is ");
              Json::Value::operator[](in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
              UVar2 = Json::Value::asUInt(in_stack_00000408);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,UVar2);
              poVar6 = std::operator<<(poVar6,"%");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)(local_198 + 0x20));
            }
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,"Meta information: ");
          poVar6 = std::operator<<(poVar6,local_10);
          this = (FastWriter *)std::operator<<(poVar6," ");
          Json::FastWriter::FastWriter(this);
          Json::FastWriter::write_abi_cxx11_
                    ((FastWriter *)local_198,(int)&stack0xfffffffffffffe38,local_18,in_RCX);
          poVar6 = std::operator<<((ostream *)this,(string *)local_198);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_198);
          Json::FastWriter::~FastWriter(this);
        }
      }
    }
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	if (method == hbm::streaming::META_METHOD_AVAILABLE) {
		std::cout << "The following signal(s) are available : ";
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
			signalReferences.push_back(element.asString());
		}
		std::cout << std::endl << std::endl;

		try {
			stream.subscribe(signalReferences);
			std::cout << "The following " << signalReferences.size() << " signal(s) were subscribed: ";
		} catch(const std::runtime_error& e) {
			std::cerr << "Error '" << e.what() << "' subscribing the following signal(s): ";
		}

		for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
			std::cout << "'" << *iter << "' ";
		}
		std::cout << std::endl << std::endl;

	} else if(method==hbm::streaming::META_METHOD_UNAVAILABLE) {
		std::cout << "The following signal(s) are not available anyore: ";

		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
		}
		std::cout << std::endl << std::endl;

	} else if(method==hbm::streaming::META_METHOD_ALIVE) {
		// We do ignore this. We are using TCP keep alive in order to detect communication problems.
	} else if(method==hbm::streaming::META_METHOD_FILL) {
		if(params.empty()==false) {
			unsigned int fill = params[0u].asUInt();
			if(fill>25) {
				std::cout << stream.address() << ": ring buffer fill level is " << params[0u].asUInt() << "%" << std::endl;
			}
		}
	} else {
		std::cout << "Meta information: " << method << " " << Json::FastWriter().write(params) << std::endl;
	}
}